

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::Object::Object(Object *this,string *name)

{
  string *in_RSI;
  undefined8 *in_RDI;
  Entity *in_stack_ffffffffffffffc0;
  box3f *this_00;
  
  Entity::Entity(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_toString_abi_cxx11__0029c3c0;
  std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::vector
            ((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *
             )0x1ec70d);
  this_00 = (box3f *)(in_RDI + 6);
  std::
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>::
  vector((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
          *)0x1ec720);
  std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
  vector((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
          *)0x1ec733);
  std::__cxx11::string::string((string *)(in_RDI + 0xc),in_RSI);
  std::mutex::mutex((mutex *)0x1ec75b);
  *(undefined1 *)(in_RDI + 0x15) = 0;
  math::box3f::box3f(this_00);
  return;
}

Assistant:

Object(const std::string &name="") : name(name) {
    }